

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Que_t *pVVar2;
  int *piVar3;
  int *piVar4;
  int i;
  int iVar5;
  abctime aVar6;
  Fx_Man_t *p;
  abctime aVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  int *fWarning;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int iVar10;
  int iDiv;
  int iVar11;
  bool bVar12;
  float fVar13;
  
  aVar6 = Abc_Clock();
  p = Fx_ManStart(vCubes);
  p->LitCountMax = LitCountMax;
  p->fCanonDivs = fCanonDivs;
  Fx_ManCreateLiterals(p,ObjIdMax);
  Fx_ManComputeLevel(p);
  Fx_ManCreateDivisors(p);
  if (fVeryVerbose != 0) {
    for (iVar11 = 0; iVar11 < p->vWeights->nSize; iVar11 = iVar11 + 1) {
      Fx_PrintDiv(p,iVar11);
    }
  }
  if (fVerbose != 0) {
    aVar7 = Abc_Clock();
    Fx_PrintStats(p,aVar7 - aVar6);
  }
  aVar7 = Abc_Clock();
  p->timeStart = aVar7;
  iVar11 = 0;
  if (0 < nNewNodesMax) {
    iVar11 = nNewNodesMax;
  }
  while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
    pVVar2 = p->vPrio;
    iVar5 = Vec_QueSize(pVVar2);
    if (iVar5 == 0) break;
    if (*pVVar2->pCostsFlt == (float *)0x0) {
      fVar13 = (float)pVVar2->pHeap[1];
    }
    else {
      fVar13 = (*pVVar2->pCostsFlt)[pVVar2->pHeap[1]];
    }
    if (fVar13 <= 0.0) break;
    pVVar2 = p->vPrio;
    if (pVVar2->nSize < 2) {
      __assert_fail("p->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xed,"int Vec_QuePop(Vec_Que_t *)");
    }
    piVar3 = pVVar2->pHeap;
    piVar4 = pVVar2->pOrder;
    iVar5 = piVar3[1];
    piVar4[iVar5] = -1;
    fWarning = (int *)(long)pVVar2->nSize;
    iVar10 = pVVar2->nSize + -1;
    pVVar2->nSize = iVar10;
    if (iVar10 == 1) {
      piVar3[1] = -1;
    }
    else {
      iVar10 = piVar3[(long)fWarning + -1];
      piVar3[(long)fWarning + -1] = -1;
      piVar3[1] = iVar10;
      piVar4[iVar10] = 1;
      Vec_QueMoveDown(pVVar2,iVar10);
      fWarning = extraout_RDX;
    }
    if (fVeryVerbose != 0) {
      Fx_PrintDiv(p,iVar5);
      fWarning = extraout_RDX_00;
    }
    Fx_ManUpdate(p,iVar5,fWarning);
  }
  if (fVerbose != 0) {
    aVar7 = Abc_Clock();
    Fx_PrintStats(p,aVar7 - aVar6);
  }
  Fx_ManStop(p);
  iVar5 = 0;
  for (iVar11 = 0; iVar10 = vCubes->nSize, i = iVar5, iVar11 < iVar10; iVar11 = iVar11 + 1) {
    pVVar8 = Vec_WecEntry(vCubes,iVar11);
    if (pVVar8->nSize < 1) {
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
        pVVar8->pArray = (int *)0x0;
      }
    }
    else {
      lVar9 = (long)iVar5;
      iVar5 = iVar5 + 1;
      iVar10 = pVVar8->nSize;
      piVar3 = pVVar8->pArray;
      pVVar1 = vCubes->pArray + lVar9;
      pVVar1->nCap = pVVar8->nCap;
      pVVar1->nSize = iVar10;
      pVVar1->pArray = piVar3;
    }
  }
  for (; iVar11 = iVar5, i < iVar10; i = i + 1) {
    pVVar8 = Vec_WecEntry(vCubes,i);
    pVVar8->nCap = 0;
    pVVar8->nSize = 0;
    pVVar8->pArray = (int *)0x0;
    iVar10 = vCubes->nSize;
  }
  for (; iVar11 < iVar10; iVar11 = iVar11 + 1) {
    pVVar8 = Vec_WecEntry(vCubes,iVar11);
    Vec_IntShrink(pVVar8,0);
    iVar10 = vCubes->nSize;
  }
  if (iVar10 < iVar5) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0xff,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = iVar5;
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintDivisors( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintDivisors( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}